

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.h
# Opt level: O1

void __thiscall
gimage::Histogram::Histogram<unsigned_char>
          (Histogram *this,Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,
          int binsize)

{
  unsigned_long *puVar1;
  int iVar2;
  uchar ***pppuVar3;
  unsigned_long *puVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  
  this->bs = 0;
  this->w = 0;
  this->h = 0;
  this->val = (unsigned_long *)0x0;
  this->row = (unsigned_long **)0x0;
  setSize(this,(int)(0x100 / (long)binsize),1,binsize);
  uVar5 = this->h * this->w;
  if (0 < (int)uVar5) {
    memset(this->val,0,(ulong)uVar5 << 3);
  }
  if (0 < image->height) {
    uVar5 = image->depth;
    lVar6 = 0;
    do {
      if (0 < image->width) {
        pppuVar3 = image->img;
        iVar2 = this->w;
        lVar7 = 0;
        do {
          if (0 < (int)uVar5) {
            puVar4 = this->val;
            uVar8 = 0;
            do {
              if ((int)(uint)pppuVar3[uVar8][lVar6][lVar7] < (iVar2 + 1) * binsize + -1) {
                puVar1 = puVar4 + (int)((long)(ulong)pppuVar3[uVar8][lVar6][lVar7] / (long)binsize);
                *puVar1 = *puVar1 + 1;
              }
              uVar8 = uVar8 + 1;
            } while (uVar5 != uVar8);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < image->width);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < image->height);
  }
  return;
}

Assistant:

Histogram(const Image<T> &image, int binsize=1)
    {
      w=h=bs=0;
      val=0;
      row=0;

      int width=std::max(256, std::min(65536, static_cast<int>(image.maxValue())))/binsize;
      setSize(width, 1, binsize);
      clear();

      for (int k=0; k<image.getHeight(); k++)
      {
        for (int i=0; i<image.getWidth(); i++)
        {
          if (image.isValid(i, k))
          {
            for (int d=0; d<image.getDepth(); d++)
            {
              T v=image.get(i, k, d);

              if (v < w*binsize+binsize-1)
              {
                val[static_cast<int>(v)/binsize]++;
              }
            }
          }
        }
      }
    }